

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int intCallback(uint user_gpio,uint edge,void *f,void *user,int ex)

{
  int iVar1;
  callback_t **ppcVar2;
  callback_t *pcVar3;
  
  iVar1 = -0x7d8;
  if (f != (void *)0x0 && (edge < 3 && user_gpio < 0x20)) {
    ppcVar2 = &gCallBackFirst;
    while (pcVar3 = *ppcVar2, pcVar3 != (callback_t *)0x0) {
      if (((pcVar3->gpio == user_gpio) && (pcVar3->edge == edge)) && (pcVar3->f == (CBF_t)f)) {
        return -0x7d6;
      }
      ppcVar2 = &pcVar3->next;
    }
    pcVar3 = (callback_t *)malloc(0x38);
    if (pcVar3 == (callback_t *)0x0) {
      iVar1 = -0x7d7;
    }
    else {
      if (gCallBackFirst == (callback_t *)0x0) {
        gCallBackFirst = pcVar3;
      }
      iVar1 = intCallback::id + 1;
      pcVar3->id = intCallback::id;
      intCallback::id = iVar1;
      pcVar3->gpio = user_gpio;
      pcVar3->edge = edge;
      pcVar3->f = (CBF_t)f;
      pcVar3->user = user;
      pcVar3->ex = ex;
      pcVar3->next = (callback_t *)0x0;
      pcVar3->prev = gCallBackLast;
      if (gCallBackLast != (callback_t *)0x0) {
        gCallBackLast->next = pcVar3;
      }
      gCallBackLast = pcVar3;
      findNotifyBits();
      iVar1 = pcVar3->id;
    }
  }
  return iVar1;
}

Assistant:

static int intCallback(unsigned user_gpio, unsigned edge, void *f, void *user, int ex)
{
   static int id = 0;
   callback_t *p;

   if ((user_gpio >=0) && (user_gpio < 32) && (edge >=0) && (edge <= 2) && f)
   {
      /* prevent duplicates */

      p = gCallBackFirst;

      while (p)
      {
         if ((p->gpio == user_gpio) && (p->edge == edge) && (p->f == f))
         {
            return pigif_duplicate_callback;
         }
         p = p->next;
      }

      p = malloc(sizeof(callback_t));

      if (p)
      {
         if (!gCallBackFirst) gCallBackFirst = p;

         p->id = id++;
         p->gpio = user_gpio;
         p->edge = edge;
         p->f = f;
         p->user = user;
         p->ex = ex;
         p->next = 0;
         p->prev = gCallBackLast;

         if (p->prev) (p->prev)->next = p;
         gCallBackLast = p;

         findNotifyBits();

         return p->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}